

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::dispose
          (ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }